

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_pool_entry>::close_oldest
          (file_pool_impl<libtorrent::aux::file_pool_entry> *this)

{
  undefined1 local_50 [40];
  unique_lock<std::mutex> l;
  FileHandle deferred_destruction;
  file_pool_impl<libtorrent::aux::file_pool_entry> *this_local;
  
  ::std::shared_ptr<libtorrent::aux::file_handle>::shared_ptr
            ((shared_ptr<libtorrent::aux::file_handle> *)&l._M_owns);
  ::std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)(local_50 + 0x20),&this->m_mutex);
  remove_oldest((file_pool_impl<libtorrent::aux::file_pool_entry> *)local_50,
                (unique_lock<std::mutex> *)this);
  ::std::shared_ptr<libtorrent::aux::file_handle>::operator=
            ((shared_ptr<libtorrent::aux::file_handle> *)&l._M_owns,
             (shared_ptr<libtorrent::aux::file_handle> *)local_50);
  ::std::shared_ptr<libtorrent::aux::file_handle>::~shared_ptr
            ((shared_ptr<libtorrent::aux::file_handle> *)local_50);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_50 + 0x20));
  ::std::shared_ptr<libtorrent::aux::file_handle>::~shared_ptr
            ((shared_ptr<libtorrent::aux::file_handle> *)&l._M_owns);
  return;
}

Assistant:

void file_pool_impl<FileEntry>::close_oldest()
	{
		// closing a file may be long running operation (mac os x)
		// destruct it after the mutex is released
		FileHandle deferred_destruction;

		std::unique_lock<std::mutex> l(m_mutex);
		deferred_destruction = remove_oldest(l);
	}